

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall
Js::EntryPointPolymorphicInlineCacheInfo::EntryPointPolymorphicInlineCacheInfo
          (EntryPointPolymorphicInlineCacheInfo *this,FunctionBody *functionBody)

{
  Recycler *pRVar1;
  
  PolymorphicInlineCacheInfo::PolymorphicInlineCacheInfo(&this->selfInfo,functionBody);
  pRVar1 = ((functionBody->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
           recycler;
  SListBase<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount>::SListBase
            ((SListBase<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount> *)
             &this->inlineeInfo);
  (this->inlineeInfo).super_SList<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount>.
  allocator = pRVar1;
  return;
}

Assistant:

EntryPointPolymorphicInlineCacheInfo::EntryPointPolymorphicInlineCacheInfo(FunctionBody * functionBody) :
        selfInfo(functionBody),
        inlineeInfo(functionBody->GetRecycler())
    {
    }